

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O2

value_type_conflict1 __thiscall
CCDPP_MPI::rank_one_update
          (CCDPP_MPI *this,
          unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
          *_R,value_type_conflict1 *to_update,value_type_conflict1 *global_the_other,
          int start_to_update_id,int end_to_update_id,int workload)

{
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *this_00;
  int iVar1;
  vector<double,_std::allocator<double>_> fun_dec;
  allocator_type local_d1;
  int local_d0;
  int local_cc;
  double local_c8;
  _Vector_base<double,_std::allocator<double>_> local_c0;
  value_type_conflict1 *local_a8;
  value_type_conflict1 *local_a0;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:129:45)_(int)>
  local_98;
  function0<void> local_50;
  
  local_d0 = end_to_update_id - start_to_update_id;
  local_50.super_function_base.vtable = (vtable_base *)0x0;
  local_cc = start_to_update_id;
  local_a8 = global_the_other;
  local_a0 = to_update;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_c0,
             (long)this->parameter->num_of_thread,(value_type_conflict1 *)&local_50,&local_d1);
  for (iVar1 = 0; this_00 = this->thread_pool, iVar1 < this->parameter->num_of_thread;
      iVar1 = iVar1 + 1) {
    local_98._M_f.workload = &workload;
    local_98._M_f.to_update_size = &local_d0;
    local_98._M_f.start_to_update_id = &local_cc;
    local_98._M_f.global_the_other = &local_a8;
    local_98._M_f.to_update = &local_a0;
    local_98._M_f.fun_dec = (vector<double,_std::allocator<double>_> *)&local_c0;
    local_98._M_f._R = _R;
    local_98._M_f.this = this;
    local_98._M_bound_args.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_int>)(_Tuple_impl<0UL,_int>)iVar1;
    boost::function0<void>::
    function0<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:129:45)_(int)>_>
              (&local_50,&local_98,0);
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::schedule(this_00,&local_50);
    boost::function0<void>::~function0(&local_50);
  }
  boost::threadpool::
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait(this_00,(void *)0x0);
  local_c8 = 0.0;
  for (; local_c0._M_impl.super__Vector_impl_data._M_start !=
         local_c0._M_impl.super__Vector_impl_data._M_finish;
      local_c0._M_impl.super__Vector_impl_data._M_start =
           local_c0._M_impl.super__Vector_impl_data._M_start + 1) {
    local_c8 = local_c8 + *local_c0._M_impl.super__Vector_impl_data._M_start;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c0);
  return local_c8;
}

Assistant:

inline value_type rank_one_update(unordered_map<int, vector<pair<int, value_type > > > &_R, value_type *to_update,
                                      value_type *global_the_other, const int start_to_update_id, const int end_to_update_id, const int workload) {

        int to_update_size = end_to_update_id - start_to_update_id; // exclusive
        vector<value_type> fun_dec(parameter->num_of_thread, 0);

        for(int thread_index=0;thread_index<parameter->num_of_thread;thread_index++){
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(workload + start, to_update_size);

                value_type prev_value;

                for (int to_update_id = start_to_update_id + start; to_update_id < start_to_update_id + end; to_update_id++) {

                    vector<pair<int, value_type > > &vec = _R[to_update_id];

                    // empty column
                    if (vec.size() == 0) {
                        continue;
                    }

                    value_type numerator = 0;
                    value_type denominator = parameter->lambda * vec.size();

                    for (int i = 0; i < vec.size(); i++) {
                        pair<int, value_type > &p = vec[i];

                        numerator += global_the_other[p.first] * p.second;
                        denominator += global_the_other[p.first] * global_the_other[p.first];
                    }

                    int to_update_index = to_update_id - start_to_update_id;
                    prev_value = to_update[to_update_index];
                    to_update[to_update_index] = numerator / denominator;

                    fun_dec[thread_index] += denominator * sqr(prev_value - to_update[to_update_index]);
                }
            },thread_index));
        }

        thread_pool->wait();

        value_type result = 0;
        for (auto value:fun_dec) {
            result += value;
        }
        return result;
    }